

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall
Js::JavascriptLibrary::CacheJsrtExternalType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t prototype,JsrtExternalType *dynamicTypeToCache)

{
  WeakReferenceDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar1;
  Recycler *recycler;
  RecyclerWeakReferenceBase *local_40;
  JsrtExternalCallbacks local_38;
  
  pWVar1 = (this->jsrtExternalTypesCache).ptr;
  recycler = this->recycler;
  local_38.traceCallback = traceCallback;
  local_38.finalizeCallback = finalizeCallback;
  local_38.prototype = prototype;
  local_40 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)dynamicTypeToCache,recycler);
  if (local_40->typeInfo == (Type)0x0) {
    local_40->typeInfo = (Type)&DynamicType::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,local_40);
  }
  JsUtil::
  BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
              *)&pWVar1->
                 super_BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
             ,&local_38,(RecyclerWeakReference<Js::DynamicType> **)&local_40);
  return;
}

Assistant:

void JavascriptLibrary::CacheJsrtExternalType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t prototype, JsrtExternalType* dynamicTypeToCache)
    {
        jsrtExternalTypesCache->Item(JsrtExternalCallbacks(traceCallback, finalizeCallback, prototype), recycler->CreateWeakReferenceHandle<DynamicType>((DynamicType*)dynamicTypeToCache));
    }